

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sslexeme.cpp
# Opt level: O3

int IsStringFloat(char *str)

{
  bool bVar1;
  size_t sVar2;
  bool bVar3;
  int i;
  size_t sVar4;
  
  if (str == (char *)0x0) {
    bVar3 = false;
  }
  else if ((*str == '\0') || (sVar2 = strlen(str), sVar2 == 0)) {
LAB_001090d2:
    bVar3 = false;
  }
  else {
    sVar4 = 0;
    do {
      if (1 < (byte)(str[sVar4] - 0x2dU) && 9 < (byte)(str[sVar4] - 0x30U)) goto LAB_001090d2;
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
    sVar4 = 0;
    bVar3 = false;
    do {
      bVar1 = bVar3;
      if ((str[sVar4] == '.') && (bVar1 = true, bVar3)) goto LAB_001090d2;
      bVar3 = bVar1;
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
    if (sVar2 != 1) {
      sVar4 = 1;
      do {
        if (str[sVar4] == '-') goto LAB_001090d2;
        sVar4 = sVar4 + 1;
      } while (sVar2 != sVar4);
    }
  }
  return (int)bVar3;
}

Assistant:

int IsStringFloat(const char* str)
{
    if (!str)
        return FALSE;

    if (strlen(str) == 0)
        return FALSE;

    for (int i = 0; i < strlen(str); i++)
    {
        if (!IsCharNumeric(str[i]) && str[i] != '-' && str[i] != '.')
            return FALSE;
    }

    int isRadixPointFound = 0;
    for (int i = 0; i < strlen(str); i++)
    {
        if (str[i] == '.')
        {
            if (isRadixPointFound)
                return FALSE;
            else
                isRadixPointFound = 1;
        }
    }

    for (int i = 1; i < strlen(str); i++)
    {
        if (str[i] == '-')
            return FALSE;
    }

    if (isRadixPointFound)
        return TRUE;
    else
        return FALSE;
}